

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void cJSON_Delete(cJSON *item)

{
  cJSON *pcVar1;
  cJSON *next;
  cJSON *item_local;
  
  next = item;
  while (next != (cJSON *)0x0) {
    pcVar1 = next->next;
    if (((next->type & 0x100U) == 0) && (next->child != (cJSON *)0x0)) {
      cJSON_Delete(next->child);
    }
    if (((next->type & 0x100U) == 0) && (next->valuestring != (char *)0x0)) {
      (*global_hooks.deallocate)(next->valuestring);
      next->valuestring = (char *)0x0;
    }
    if (((next->type & 0x200U) == 0) && (next->string != (char *)0x0)) {
      (*global_hooks.deallocate)(next->string);
      next->string = (char *)0x0;
    }
    (*global_hooks.deallocate)(next);
    next = pcVar1;
  }
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_Delete(cJSON *item)
{
    cJSON *next = NULL;
    while (item != NULL)
    {
        next = item->next;
        if (!(item->type & cJSON_IsReference) && (item->child != NULL))
        {
            cJSON_Delete(item->child);
        }
        if (!(item->type & cJSON_IsReference) && (item->valuestring != NULL))
        {
            global_hooks.deallocate(item->valuestring);
            item->valuestring = NULL;
        }
        if (!(item->type & cJSON_StringIsConst) && (item->string != NULL))
        {
            global_hooks.deallocate(item->string);
            item->string = NULL;
        }
        global_hooks.deallocate(item);
        item = next;
    }
}